

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  size_t sz;
  long lVar1;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *message;
  _func_int **pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  A alloc;
  E equal;
  H hasher;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> local_619;
  AssertHelper local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_610;
  undefined1 local_608 [8];
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_600;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_5e8;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_5e0;
  allocator_type local_5c8;
  key_equal local_5c0;
  hasher local_5b8;
  undefined4 local_5b0;
  pointer local_5a8;
  pointer ppStack_5a0;
  pointer local_598;
  pair<const_phmap::priv::NonStandardLayout,_int> local_590;
  pair<const_phmap::priv::NonStandardLayout,_int> local_560;
  pair<const_phmap::priv::NonStandardLayout,_int> local_530;
  pair<const_phmap::priv::NonStandardLayout,_int> local_500;
  pair<const_phmap::priv::NonStandardLayout,_int> local_4d0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_4a0;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_590,&local_619);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_560,&local_619);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_530,&local_619);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_500,&local_619);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_4d0,&local_619);
  local_5b8.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)
       (WithId<phmap::priv::StatefulTestingHash>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_5c0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (WithId<phmap::priv::StatefulTestingEqual>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_5c8.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::NonStandardLayout_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_4a0,&local_590,(pair<const_phmap::priv::NonStandardLayout,_int> *)&local_4a0,
             0x7b,&local_5b8,&local_5c0,&local_5c8);
  local_5e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_4a0.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingHash>.id_;
  testing::internal::CmpHelperEQ<phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingHash>
            ((internal *)local_608,"m.hash_function()","hasher",(StatefulTestingHash *)&local_5e8,
             &local_5b8);
  if (local_608[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5e8);
    if (local_600.
        super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pp_Var2 = (_func_int **)0x2df8bf;
    }
    else {
      pp_Var2 = ((local_600.
                  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_NonStandardLayout;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x158,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_5e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5e8._M_head_impl + 8))();
    }
  }
  if (local_600.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_600.
                 super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_4a0.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::StatefulTestingEqual,phmap::priv::StatefulTestingEqual>
            ((internal *)local_608,"m.key_eq()","equal",(StatefulTestingEqual *)&local_5e8,
             &local_5c0);
  if (local_608[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5e8);
    if (local_600.
        super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pp_Var2 = (_func_int **)0x2df8bf;
    }
    else {
      pp_Var2 = ((local_600.
                  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_NonStandardLayout;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x159,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_5e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5e8._M_head_impl + 8))();
    }
  }
  if (local_600.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_600.
                 super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_4a0.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
       ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
            ((internal *)local_608,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)&local_5e8,&local_5c8);
  if (local_608[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5e8);
    if (local_600.
        super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pp_Var2 = (_func_int **)0x2df8bf;
    }
    else {
      pp_Var2 = ((local_600.
                  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_NonStandardLayout;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15a,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_5e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5e8._M_head_impl + 8))();
    }
  }
  if (local_600.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_600.
                 super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5b0 = 3;
  std::
  vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::vector<std::pair<phmap::priv::NonStandardLayout_const,int>const*,void>
            ((vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_5a8,&local_590,(pair<const_phmap::priv::NonStandardLayout,_int> *)&local_4a0,
             (allocator_type *)local_608);
  local_5e0.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_598;
  local_5e0.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppStack_5a0;
  local_5e0.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_5a8;
  local_608._0_4_ = local_5b0;
  local_598 = (pointer)0x0;
  local_5a8 = (pointer)0x0;
  ppStack_5a0 = (pointer)0x0;
  local_5e8._M_head_impl._0_4_ = local_5b0;
  local_600.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_600.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_600.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_600);
  items<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>>
            ((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
              *)local_608,(priv *)&local_4a0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::operator()(&local_618,(char *)&local_5e8,
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
             *)local_608);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_5e0);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)&local_5a8);
  if ((char)local_618.data_ == '\0') {
    testing::Message::Message((Message *)local_608);
    if (local_610 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_610->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
    if ((long *)CONCAT44(local_608._4_4_,local_608._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_608._4_4_,local_608._0_4_) + 8))();
    }
  }
  if (local_610 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_610,local_610);
  }
  lVar1 = 0x18;
  local_5e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    local_5e8._M_head_impl =
         local_5e8._M_head_impl + *(long *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar1);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_618.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_608,"m.bucket_count()","123",(unsigned_long *)&local_5e8,
             (int *)&local_618);
  if (local_608[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5e8);
    if (local_600.
        super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pp_Var2 = (_func_int **)0x2df8bf;
    }
    else {
      pp_Var2 = ((local_600.
                  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_NonStandardLayout;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15c,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_5e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5e8._M_head_impl + 8))();
    }
  }
  if (local_600.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_600.
                 super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_4a0);
  lVar1 = -0xf0;
  paVar3 = &local_4d0.first.value.field_2;
  do {
    (&paVar3->_M_allocated_capacity)[-3] = (size_type)&PTR__NonStandardLayout_0034a128;
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -6);
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, InitializerListBucketHashEqualAlloc) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  using H = typename TypeParam::hasher;
  using E = typename TypeParam::key_equal;
  using A = typename TypeParam::allocator_type;
  H hasher;
  E equal;
  A alloc(0);
  TypeParam m(values, 123, hasher, equal, alloc);
  EXPECT_EQ(m.hash_function(), hasher);
  EXPECT_EQ(m.key_eq(), equal);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}